

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O0

size_t __thiscall
CCharmapToUniUTF8::map2
          (CCharmapToUniUTF8 *this,char **outp,size_t *outlen,char *inp,size_t inlen,
          size_t *partial_len)

{
  void *in_RCX;
  ulong *in_RDX;
  long *in_RSI;
  size_t in_R8;
  long *in_R9;
  size_t copy_len;
  undefined8 local_38;
  
  local_38 = utf8_ptr::s_trunc((char *)in_RDX,(size_t)in_RCX);
  *in_R9 = in_R8 - local_38;
  if (*in_RDX < local_38) {
    local_38 = utf8_ptr::s_trunc((char *)in_RDX,(size_t)in_RCX);
    *in_RDX = 0;
  }
  else {
    *in_RDX = *in_RDX - local_38;
  }
  if (in_RSI != (long *)0x0) {
    memcpy((void *)*in_RSI,in_RCX,local_38);
    CCharmapToUni::validate((char *)*in_RSI,local_38);
    *in_RSI = local_38 + *in_RSI;
  }
  return in_R8;
}

Assistant:

size_t CCharmapToUniUTF8::map2(char **outp, size_t *outlen,
                               const char *inp, size_t inlen,
                               size_t *partial_len) const
{
    size_t copy_len;

    /* 
     *   Make sure we copy only whole characters, by truncating the string
     *   to a length that includes only whole characters.  
     */
    copy_len = utf8_ptr::s_trunc(inp, inlen);

    /* 
     *   note the length of any partial characters at the end of the buffer
     *   for the caller - this is simply the difference between the original
     *   length and the truncated copy length, since the truncation length
     *   is simply the length excluding the partial last character bytes 
     */
    *partial_len = inlen - copy_len;

    /* limit the copying to what will fit in the output buffer */
    if (copy_len > *outlen)
    {
        /* don't copy more than will fit, and don't copy partial characters */
        copy_len = utf8_ptr::s_trunc(inp, *outlen);

        /* we don't have enough room, so set the output size to zero */
        *outlen = 0;
    }
    else
    {
        /* we have room, so decrement the output size by the copy size */
        *outlen -= copy_len;
    }

    /* copy the data, if we have an output buffer */
    if (outp != 0)
    {
        /* copy the bytes */
        memcpy(*outp, inp, copy_len);

        /* validate that the bytes we copied are well-formed UTF-8 */
        validate(*outp, copy_len);
        
        /* advance the output pointer past the copied data */
        *outp += copy_len;
    }

    /* 
     *   return the total input length -- the total output length is
     *   always identical to the input length, because we don't change
     *   anything 
     */
    return inlen;
}